

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O0

QString * __thiscall
FileHdrWrapper::translateFieldContent
          (QString *__return_storage_ptr__,FileHdrWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PEFile *local_68;
  PEFile *myPe;
  IMAGE_FILE_HEADER *fileHeader;
  IMAGE_FILE_HEADER *hdr;
  size_t fieldId_local;
  FileHdrWrapper *this_local;
  ushort *puVar4;
  
  iVar3 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  puVar4 = (ushort *)CONCAT44(extraout_var,iVar3);
  if (puVar4 == (ushort *)0x0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else if (fieldId == 0) {
    translateMachine(__return_storage_ptr__,(uint)*puVar4);
  }
  else if (fieldId == 2) {
    pEVar1 = (this->super_PEElementWrapper).super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
      local_68 = (PEFile *)0x0;
    }
    else {
      local_68 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0);
    }
    if ((local_68 == (PEFile *)0x0) || (bVar2 = PEFile::isReproBuild(local_68), !bVar2)) {
      util::getDateString(__return_storage_ptr__,(ulong)*(uint *)(puVar4 + 2));
    }
    else {
      QString::QString(__return_storage_ptr__,"");
    }
  }
  else {
    QString::QString(__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

QString FileHdrWrapper::translateFieldContent(size_t fieldId)
{
    IMAGE_FILE_HEADER * hdr = reinterpret_cast<IMAGE_FILE_HEADER*>(getPtr());
    if (!hdr) return "";

    IMAGE_FILE_HEADER &fileHeader = (*hdr);
    switch (fieldId) {
        case MACHINE: return FileHdrWrapper::translateMachine(fileHeader.Machine);
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return ""; // This is not a real timestamp
            }
            return util::getDateString(fileHeader.TimeDateStamp);
        }
    }
    return "";
}